

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

void * fits_recalloc(void *ptr,size_t old_num,size_t new_num,size_t size)

{
  size_t in_RCX;
  size_t in_RDX;
  ulong in_RSI;
  void *in_RDI;
  void *newptr;
  undefined8 local_8;
  
  if ((in_RDI == (void *)0x0) || (in_RSI == 0)) {
    local_8 = calloc(in_RDX,in_RCX);
  }
  else {
    local_8 = in_RDI;
    if (in_RDX != in_RSI) {
      if (in_RDX == 0) {
        if (in_RDI != (void *)0x0) {
          free(in_RDI);
        }
        local_8 = (void *)0x0;
      }
      else if (in_RDX < in_RSI) {
        local_8 = realloc(in_RDI,in_RDX * in_RCX);
        if (local_8 == (void *)0x0) {
          free(in_RDI);
        }
      }
      else {
        local_8 = realloc(in_RDI,in_RDX * in_RCX);
        if (local_8 == (void *)0x0) {
          free(in_RDI);
        }
        else {
          memset((void *)((long)local_8 + in_RSI * in_RCX),0,(in_RDX - in_RSI) * in_RCX);
        }
      }
    }
  }
  return local_8;
}

Assistant:

void *fits_recalloc(void *ptr, size_t old_num, size_t new_num, size_t size)
{
  void *newptr;

  if (ptr == 0 || old_num == 0) { /* Starting from nothing */

    return calloc(new_num, size);

  } else if (new_num == old_num) { /* Same size, do nothing */
    
    return ptr;

  } else if (new_num == 0) { /* Freeing */

    if (ptr) free(ptr);
    return 0;

  } else if (new_num < old_num) { /* Shrinking */
    
    newptr = realloc(ptr, new_num*size);
    if (!newptr) free(ptr);
    return (newptr);
  }

  /* Growing */
  newptr = realloc(ptr, new_num*size);
  if (!newptr) {
    free(ptr);
    return newptr;
  }

  /* Zero the new portion of the array */
  memset( (char *) newptr + old_num*size/sizeof(char), 0,
	  (new_num - old_num)*size );
  return (newptr);
}